

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatMem.c
# Opt level: O3

void Msat_MmStepStop(Msat_MmStep_t *p,int fVerbose)

{
  long lVar1;
  
  if (0 < p->nMems) {
    lVar1 = 0;
    do {
      Msat_MmFixedStop(p->pMems[lVar1],fVerbose);
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nMems);
  }
  if (p->pMems != (Msat_MmFixed_t **)0x0) {
    free(p->pMems);
    p->pMems = (Msat_MmFixed_t **)0x0;
  }
  if (p->pMap != (Msat_MmFixed_t **)0x0) {
    free(p->pMap);
  }
  free(p);
  return;
}

Assistant:

void Msat_MmStepStop( Msat_MmStep_t * p, int fVerbose )
{
    int i;
    for ( i = 0; i < p->nMems; i++ )
        Msat_MmFixedStop( p->pMems[i], fVerbose );
    ABC_FREE( p->pMems );
    ABC_FREE( p->pMap );
    ABC_FREE( p );
}